

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmBrReg1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,ByteCodeLabel labelID,RegSlot R1,int C1)

{
  bool bVar1;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  unsigned_short uStack_2e;
  undefined1 auStack_2c [2];
  OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  int C1_local;
  RegSlot R1_local;
  ByteCodeLabel labelID_local;
  OpCodeAsmJs op_local;
  WasmByteCodeWriter *this_local;
  
  layout._2_4_ = C1;
  layout.C1 = R1;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>(&uStack_2e,R1);
  if ((bVar1) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<int,int>((int *)auStack_2c,layout._2_4_),
     bVar1)) {
    stack0xffffffffffffffce = 10;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,
               (void *)((long)&offsetOfRelativeJumpOffsetFromEnd + 6),10,&this->super_ByteCodeWriter
               ,false);
    AddJumpOffset(this,op,labelID,10);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmBrReg1Const1(OpCodeAsmJs op, ByteCodeLabel labelID, RegSlot R1, int C1)
    {
        OpLayoutT_BrInt1Const1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.I1, R1) && SizePolicy::Assign(layout.C1, C1))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrInt1Const1<SizePolicy>) - offsetof(OpLayoutT_BrInt1Const1<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }